

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestPoolEdgesReadyButNotWanted::Run(BuildTestPoolEdgesReadyButNotWanted *this)

{
  VirtualFileSystem *this_00;
  Test *this_01;
  Pool *pPVar1;
  State save_state;
  allocator<char> local_13a;
  allocator<char> local_139;
  string local_138;
  State local_118;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"x",&local_13a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_139);
  this_00 = &(this->super_BuildTest).fs_;
  VirtualFileSystem::Create(this_00,(string *)&local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"final.stamp",(allocator<char> *)&local_138);
  BuildTest::RebuildTarget
            (&this->super_BuildTest,(string *)&local_118,
             "pool some_pool\n  depth = 4\nrule touch\n  command = touch $out\n  pool = some_pool\nrule cc\n  command = touch grit\n\nbuild B.d.stamp: cc | x\nbuild C.stamp: touch B.d.stamp\nbuild final.stamp: touch || C.stamp\n"
             ,(char *)0x0,(char *)0x0,(State *)0x0);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"B.d.stamp",(allocator<char> *)&local_138);
  VirtualFileSystem::RemoveFile(this_00,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  State::State(&local_118);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"final.stamp",&local_13a);
  BuildTest::RebuildTarget
            (&this->super_BuildTest,&local_138,
             "pool some_pool\n  depth = 4\nrule touch\n  command = touch $out\n  pool = some_pool\nrule cc\n  command = touch grit\n\nbuild B.d.stamp: cc | x\nbuild C.stamp: touch B.d.stamp\nbuild final.stamp: touch || C.stamp\n"
             ,(char *)0x0,(char *)0x0,&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  this_01 = g_current_test;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"some_pool",&local_13a);
  pPVar1 = State::LookupPool(&local_118,&local_138);
  testing::Test::Check
            (this_01,(bool)((byte)~(byte)((uint)pPVar1->current_use_ >> 0x18) >> 7),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x5a8,"save_state.LookupPool(\"some_pool\")->current_use() >= 0");
  std::__cxx11::string::~string((string *)&local_138);
  State::~State(&local_118);
  return;
}

Assistant:

TEST_F(BuildTest, PoolEdgesReadyButNotWanted) {
  fs_.Create("x", "");

  const char* manifest =
    "pool some_pool\n"
    "  depth = 4\n"
    "rule touch\n"
    "  command = touch $out\n"
    "  pool = some_pool\n"
    "rule cc\n"
    "  command = touch grit\n"
    "\n"
    "build B.d.stamp: cc | x\n"
    "build C.stamp: touch B.d.stamp\n"
    "build final.stamp: touch || C.stamp\n";

  RebuildTarget("final.stamp", manifest);

  fs_.RemoveFile("B.d.stamp");

  State save_state;
  RebuildTarget("final.stamp", manifest, NULL, NULL, &save_state);
  EXPECT_GE(save_state.LookupPool("some_pool")->current_use(), 0);
}